

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

vec4 ImageCodec::decodeFLOAT_SINTPacked<short>(ImageCodec *codec,void *ptr)

{
  uint32_t numBits;
  pointer pSVar1;
  byte bVar2;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar3;
  int32_t iVar4;
  float *pfVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_48;
  
  local_48._0_8_ = 0;
  local_48._8_8_ = 0x3f80000000000000;
  lVar7 = 8;
  for (uVar6 = 0;
      pSVar1 = (codec->packedSampleInfo).
               super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(codec->packedSampleInfo).
                             super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xc);
      uVar6 = uVar6 + 1) {
    numBits = *(uint32_t *)((long)&pSVar1->elementIndex + lVar7);
    bVar2 = (byte)numBits;
    iVar4 = imageio::sign_extend
                      (~(-1 << (bVar2 & 0x1f)) &
                       (uint)(*(ushort *)
                               ((long)ptr + (ulong)*(uint *)((long)pSVar1 + lVar7 + -8) * 2) >>
                             (*(byte *)((long)pSVar1 + lVar7 + -4) & 0x1f)),numBits);
    pfVar5 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)&local_48.field_0,(length_type)uVar6);
    *pfVar5 = (float)iVar4 / (float)~(-1 << (bVar2 - 1 & 0x1f));
    lVar7 = lVar7 + 0xc;
  }
  aVar3._8_8_ = local_48._8_8_;
  aVar3._0_8_ = local_48._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar3.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        auto data = reinterpret_cast<const std::make_unsigned_t<TYPE>*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            const auto upper = static_cast<float>((1u << (info.bitLength - 1)) - 1u);
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = static_cast<float>(imageio::sign_extend(rawValue, info.bitLength)) / upper;
        }
        return result;
    }